

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

uint64_t __thiscall DnsStats::GetLeaksRef(DnsStats *this)

{
  DnsHashEntry *pDVar1;
  long lVar2;
  uint64_t uVar3;
  DnsHashEntry key;
  DnsHashEntry local_98;
  
  local_98.HashNext = (DnsHashEntry *)0x0;
  lVar2 = 0;
  uVar3 = 0;
  do {
    local_98.count = 0;
    local_98.hash = 0;
    local_98.registry_id = 0x1b;
    local_98.key_type = 0;
    local_98.key_length = 4;
    local_98.field_6.key_number = *(uint32_t *)((long)&DAT_0019a760 + lVar2);
    pDVar1 = BinHash<DnsHashEntry>::Retrieve(&this->hashTable,&local_98);
    if (pDVar1 != (DnsHashEntry *)0x0) {
      uVar3 = uVar3 + pDVar1->count;
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 == 4);
  return uVar3;
}

Assistant:

uint64_t DnsStats::GetLeaksRef()
{
    DnsHashEntry key;
    DnsHashEntry * r_key;
    uint64_t leaks_ref = 0;
    const uint32_t rcode[2] = { DNS_RCODE_NXDOMAIN, DNS_RCODE_NOERROR };

    for (int i = 0; i < 2; i++) {
        key.count = 0;
        key.hash = 0;
        key.registry_id = REGISTRY_DNS_root_QR;
        key.key_length = sizeof(uint32_t);
        key.key_type = 0; /* number */
        key.key_number = rcode[i];

        r_key = (DnsHashEntry*)hashTable.Retrieve(&key);
        if (r_key != NULL) {
            leaks_ref += r_key->count;
        }
    }

    return leaks_ref;
}